

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate.cc
# Opt level: O3

void accumulate_avg(vw *all,parameters *weights,size_t offset)

{
  sparse_parameters *psVar1;
  uint32_t uVar2;
  _func_void_weight_ptr_void_ptr *p_Var3;
  ulong uVar4;
  weight *pwVar5;
  uint64_t i_2;
  float *buffer;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var6;
  uint64_t i;
  size_t sVar7;
  size_t n;
  uint64_t index;
  ulong local_60;
  float local_54;
  vw *local_50;
  size_t local_48;
  ulong local_40;
  float *local_38;
  
  n = 1L << ((byte)all->num_bits & 0x3f);
  local_54 = (float)all->all_reduce->total;
  local_50 = all;
  buffer = (float *)operator_new__(n * 4);
  local_48 = offset;
  if (weights->sparse == false) {
    uVar2 = (weights->dense_weights)._stride_shift;
    uVar4 = (weights->dense_weights)._weight_mask;
    pwVar5 = (weights->dense_weights)._begin;
    sVar7 = 0;
    do {
      buffer[sVar7] = pwVar5[offset + (sVar7 << ((byte)uVar2 & 0x3f) & uVar4)];
      sVar7 = sVar7 + 1;
    } while (n != sVar7);
  }
  else {
    psVar1 = &weights->sparse_weights;
    sVar7 = 0;
    do {
      local_60 = sVar7 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                 (weights->sparse_weights)._weight_mask;
      _Var6._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)psVar1,&local_60);
      if (_Var6._M_cur == (__node_type *)0x0) {
        local_38 = calloc_or_throw<float>
                             (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
        local_40 = local_60;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,float*>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)psVar1,&local_40);
        _Var6._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)psVar1,&local_60);
        p_Var3 = (weights->sparse_weights).fun;
        if (p_Var3 != (_func_void_weight_ptr_void_ptr *)0x0) {
          (*p_Var3)(*(weight **)((long)_Var6._M_cur + 0x10),(weights->sparse_weights).default_data);
        }
      }
      buffer[sVar7] =
           *(float *)(*(long *)((long)&((_Var6._M_cur)->
                                       super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                       ).
                                       super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                       ._M_storage._M_storage + 8) + local_48 * 4);
      sVar7 = sVar7 + 1;
    } while (n != sVar7);
  }
  all_reduce<float,_&add_float>(local_50,buffer,n);
  if (weights->sparse == false) {
    sVar7 = 0;
    do {
      (weights->dense_weights)._begin
      [(sVar7 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
       (weights->dense_weights)._weight_mask) + local_48] = buffer[sVar7] / local_54;
      sVar7 = sVar7 + 1;
    } while (n != sVar7);
  }
  else {
    psVar1 = &weights->sparse_weights;
    sVar7 = 0;
    do {
      local_50 = (vw *)CONCAT44(local_50._4_4_,buffer[sVar7]);
      local_60 = sVar7 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                 (weights->sparse_weights)._weight_mask;
      _Var6._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)psVar1,&local_60);
      if (_Var6._M_cur == (__node_type *)0x0) {
        local_38 = calloc_or_throw<float>
                             (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
        local_40 = local_60;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,float*>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)psVar1,&local_40);
        _Var6._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)psVar1,&local_60);
        p_Var3 = (weights->sparse_weights).fun;
        if (p_Var3 != (_func_void_weight_ptr_void_ptr *)0x0) {
          (*p_Var3)(*(weight **)((long)_Var6._M_cur + 0x10),(weights->sparse_weights).default_data);
        }
      }
      *(float *)(*(long *)((long)&((_Var6._M_cur)->
                                  super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                  ._M_storage._M_storage + 8) + local_48 * 4) =
           local_50._0_4_ / local_54;
      sVar7 = sVar7 + 1;
    } while (n != sVar7);
  }
  operator_delete__(buffer);
  return;
}

Assistant:

void accumulate_avg(vw& all, parameters& weights, size_t offset)
{
  uint32_t length = 1 << all.num_bits;  // This is size of gradient
  float numnodes = (float)all.all_reduce->total;
  float* local_grad = new float[length];

  if (weights.sparse)
    for (uint64_t i = 0; i < length; i++)
      local_grad[i] = (&(weights.sparse_weights[i << weights.sparse_weights.stride_shift()]))[offset];
  else
    for (uint64_t i = 0; i < length; i++)
      local_grad[i] = (&(weights.dense_weights[i << weights.dense_weights.stride_shift()]))[offset];

  all_reduce<float, add_float>(all, local_grad, length);  // TODO: modify to not use first()

  if (weights.sparse)
    for (uint64_t i = 0; i < length; i++)
      (&(weights.sparse_weights[i << weights.sparse_weights.stride_shift()]))[offset] = local_grad[i] / numnodes;
  else
    for (uint64_t i = 0; i < length; i++)
      (&(weights.dense_weights[i << weights.dense_weights.stride_shift()]))[offset] = local_grad[i] / numnodes;

  delete[] local_grad;
}